

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# game_impl.cpp
# Opt level: O0

void __thiscall gamespace::GameScreenImpl::renderTerrain(GameScreenImpl *this)

{
  mat4 m_00;
  mat4 m_01;
  mat4 m_02;
  vec3 v;
  vec3 v_00;
  vec3 v_01;
  Program *pPVar1;
  pointer pCVar2;
  Matrices *pMVar3;
  pointer pMVar4;
  reference pvVar5;
  vec<3,_float,_(glm::qualifier)0> *v_02;
  vec<3,_float,_(glm::qualifier)0> vVar6;
  Program *local_230;
  undefined8 local_1f4;
  undefined4 local_1ec;
  undefined8 local_1e8;
  undefined4 local_1e0;
  undefined8 local_1d4;
  undefined4 local_1cc;
  undefined8 local_1c8;
  undefined4 local_1c0;
  undefined8 local_1b4;
  undefined4 local_1ac;
  hexpoint_t local_1a8;
  anon_union_8_3_e2189aaa_for_vec<2,_unsigned_int,_(glm::qualifier)0>_3 local_1a0;
  anon_union_8_3_e2189aaa_for_vec<2,_unsigned_int,_(glm::qualifier)0>_3 local_198;
  undefined8 local_190;
  undefined8 uStack_188;
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 local_170;
  undefined8 uStack_168;
  undefined8 local_160;
  undefined8 uStack_158;
  undefined8 local_150;
  undefined8 uStack_148;
  undefined8 local_140;
  undefined8 uStack_138;
  undefined8 local_130;
  undefined8 uStack_128;
  undefined8 local_120;
  undefined8 uStack_118;
  undefined8 local_110;
  undefined8 uStack_108;
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 local_f0;
  undefined8 uStack_e8;
  undefined8 local_e0;
  undefined8 uStack_d8;
  Program *local_d0;
  Program *ts;
  mat4 mvp;
  vec<3,float,(glm::qualifier)0> local_74 [12];
  vec<3,float,(glm::qualifier)0> local_68 [12];
  undefined8 local_5c;
  undefined4 local_54;
  undefined1 local_50 [8];
  mat4 m;
  GameScreenImpl *this_local;
  
  m.value[3].field_0._8_8_ = this;
  glm::vec<3,float,(glm::qualifier)0>::vec<double,int,double>(local_68,18.099,0,10.963);
  glm::vec<3,float,(glm::qualifier)0>::vec<double,int,double>(local_74,-1.732,0,-1.0);
  vVar6 = glm::operator+((vec<3,_float,_(glm::qualifier)0> *)local_68,
                         (vec<3,_float,_(glm::qualifier)0> *)local_74);
  local_54 = vVar6.field_0._8_4_;
  mvp.value[3].field_0._8_8_ = vVar6.field_0._0_8_;
  local_5c = mvp.value[3].field_0._8_8_;
  glm::translate<float,(glm::qualifier)0>
            ((mat<4,_4,_float,_(glm::qualifier)0> *)local_50,(glm *)&local_5c,v_02);
  pCVar2 = std::unique_ptr<qe::Camera,_std::default_delete<qe::Camera>_>::operator->
                     (&(this->_cam).camera);
  pMVar3 = qe::Camera::matrices(pCVar2);
  glm::operator*((mat<4,_4,_float,_(glm::qualifier)0> *)&ts,&pMVar3->pv,
                 (mat<4,_4,_float,_(glm::qualifier)0> *)local_50);
  if ((this->_terrain_render_geometry_pass & 1U) == 0) {
    local_230 = std::unique_ptr<qe::Program,_std::default_delete<qe::Program>_>::get
                          (&this->_terrain_shader);
  }
  else {
    local_230 = std::unique_ptr<qe::Program,_std::default_delete<qe::Program>_>::get
                          (&this->_terrain_tileno_shader);
  }
  local_d0 = local_230;
  qe::Program::use(local_230);
  pPVar1 = local_d0;
  memcpy(&local_110,&ts,0x40);
  m_00.value[0].field_0._8_8_ = uStack_108;
  m_00.value[0].field_0._0_8_ = local_110;
  m_00.value[1].field_0._0_8_ = local_100;
  m_00.value[1].field_0._8_8_ = uStack_f8;
  m_00.value[2].field_0._0_8_ = local_f0;
  m_00.value[2].field_0._8_8_ = uStack_e8;
  m_00.value[3].field_0._0_8_ = local_e0;
  m_00.value[3].field_0._8_8_ = uStack_d8;
  qe::Program::setUniform<0u>(pPVar1,m_00);
  pPVar1 = local_d0;
  memcpy(&local_150,local_50,0x40);
  m_01.value[0].field_0._8_8_ = uStack_148;
  m_01.value[0].field_0._0_8_ = local_150;
  m_01.value[1].field_0._0_8_ = local_140;
  m_01.value[1].field_0._8_8_ = uStack_138;
  m_01.value[2].field_0._0_8_ = local_130;
  m_01.value[2].field_0._8_8_ = uStack_128;
  m_01.value[3].field_0._0_8_ = local_120;
  m_01.value[3].field_0._8_8_ = uStack_118;
  qe::Program::setUniform<1u>(pPVar1,m_01);
  pPVar1 = local_d0;
  pCVar2 = std::unique_ptr<qe::Camera,_std::default_delete<qe::Camera>_>::operator->
                     (&(this->_cam).camera);
  pMVar3 = qe::Camera::matrices(pCVar2);
  memcpy(&local_190,&pMVar3->v,0x40);
  m_02.value[0].field_0._8_8_ = uStack_188;
  m_02.value[0].field_0._0_8_ = local_190;
  m_02.value[1].field_0._0_8_ = local_180;
  m_02.value[1].field_0._8_8_ = uStack_178;
  m_02.value[2].field_0._0_8_ = local_170;
  m_02.value[2].field_0._8_8_ = uStack_168;
  m_02.value[3].field_0._0_8_ = local_160;
  m_02.value[3].field_0._8_8_ = uStack_158;
  qe::Program::setUniform<2u>(pPVar1,m_02);
  pPVar1 = local_d0;
  if ((this->_terrain_render_geometry_pass & 1U) == 0) {
    if (((this->_cam).controlling & 1U) == 0) {
      local_1a8 = (this->_selection).lastLookedAtTile;
      local_1a0.field_0 =
           (anon_struct_8_2_947311e6_for_anon_union_8_3_e2189aaa_for_vec<2,_unsigned_int,_(glm::qualifier)0>_3_0
            )to_uvec2(local_1a8);
      qe::Program::setUniform<8u>(pPVar1,(uvec2)local_1a0.field_0);
    }
    else {
      glm::vec<2,unsigned_int,(glm::qualifier)0>::vec<int,int>
                ((vec<2,unsigned_int,(glm::qualifier)0> *)&local_198.field_0,9999,9999);
      qe::Program::setUniform<8u>(pPVar1,(uvec2)local_198);
    }
    pPVar1 = local_d0;
    glm::vec<3,float,(glm::qualifier)0>::vec<double,double,double>
              ((vec<3,float,(glm::qualifier)0> *)&local_1b4,0.8,0.8,0.8);
    local_1c0 = local_1ac;
    local_1c8 = local_1b4;
    v_01.field_0.field_0.z = (float)local_1ac;
    v_01.field_0._0_8_ = local_1b4;
    qe::Program::setUniform<5u>(pPVar1,v_01);
  }
  pMVar4 = std::unique_ptr<qe::Mesh<7U>,_std::default_delete<qe::Mesh<7U>_>_>::operator->
                     (&this->_ground);
  pvVar5 = std::array<qe::subobj_t,_16UL>::operator[](&this->_ground_indices,10);
  qe::Mesh<7U>::render_sub(pMVar4,pvVar5);
  pMVar4 = std::unique_ptr<qe::Mesh<7U>,_std::default_delete<qe::Mesh<7U>_>_>::operator->
                     (&this->_ground);
  pvVar5 = std::array<qe::subobj_t,_16UL>::operator[](&this->_ground_indices,9);
  qe::Mesh<7U>::render_sub(pMVar4,pvVar5);
  pMVar4 = std::unique_ptr<qe::Mesh<7U>,_std::default_delete<qe::Mesh<7U>_>_>::operator->
                     (&this->_ground);
  pvVar5 = std::array<qe::subobj_t,_16UL>::operator[](&this->_ground_indices,6);
  qe::Mesh<7U>::render_sub(pMVar4,pvVar5);
  pMVar4 = std::unique_ptr<qe::Mesh<7U>,_std::default_delete<qe::Mesh<7U>_>_>::operator->
                     (&this->_ground);
  pvVar5 = std::array<qe::subobj_t,_16UL>::operator[](&this->_ground_indices,5);
  qe::Mesh<7U>::render_sub(pMVar4,pvVar5);
  pMVar4 = std::unique_ptr<qe::Mesh<7U>,_std::default_delete<qe::Mesh<7U>_>_>::operator->
                     (&this->_ground);
  pvVar5 = std::array<qe::subobj_t,_16UL>::operator[](&this->_ground_indices,2);
  qe::Mesh<7U>::render_sub(pMVar4,pvVar5);
  pMVar4 = std::unique_ptr<qe::Mesh<7U>,_std::default_delete<qe::Mesh<7U>_>_>::operator->
                     (&this->_ground);
  pvVar5 = std::array<qe::subobj_t,_16UL>::operator[](&this->_ground_indices,1);
  qe::Mesh<7U>::render_sub(pMVar4,pvVar5);
  pMVar4 = std::unique_ptr<qe::Mesh<7U>,_std::default_delete<qe::Mesh<7U>_>_>::operator->
                     (&this->_ground);
  pvVar5 = std::array<qe::subobj_t,_16UL>::operator[](&this->_ground_indices,0);
  qe::Mesh<7U>::render_sub(pMVar4,pvVar5);
  pMVar4 = std::unique_ptr<qe::Mesh<7U>,_std::default_delete<qe::Mesh<7U>_>_>::operator->
                     (&this->_ground);
  pvVar5 = std::array<qe::subobj_t,_16UL>::operator[](&this->_ground_indices,7);
  qe::Mesh<7U>::render_sub(pMVar4,pvVar5);
  pMVar4 = std::unique_ptr<qe::Mesh<7U>,_std::default_delete<qe::Mesh<7U>_>_>::operator->
                     (&this->_ground);
  pvVar5 = std::array<qe::subobj_t,_16UL>::operator[](&this->_ground_indices,8);
  qe::Mesh<7U>::render_sub(pMVar4,pvVar5);
  pPVar1 = local_d0;
  if ((this->_terrain_render_geometry_pass & 1U) == 0) {
    glm::vec<3,float,(glm::qualifier)0>::vec<double,double,double>
              ((vec<3,float,(glm::qualifier)0> *)&local_1d4,0.8,0.567,0.305);
    local_1e0 = local_1cc;
    local_1e8 = local_1d4;
    v_00.field_0.field_0.z = (float)local_1cc;
    v_00.field_0._0_8_ = local_1d4;
    qe::Program::setUniform<5u>(pPVar1,v_00);
  }
  pMVar4 = std::unique_ptr<qe::Mesh<7U>,_std::default_delete<qe::Mesh<7U>_>_>::operator->
                     (&this->_ground);
  pvVar5 = std::array<qe::subobj_t,_16UL>::operator[](&this->_ground_indices,0xb);
  qe::Mesh<7U>::render_sub(pMVar4,pvVar5);
  pPVar1 = local_d0;
  if ((this->_terrain_render_geometry_pass & 1U) == 0) {
    glm::vec<3,float,(glm::qualifier)0>::vec<double,double,double>
              ((vec<3,float,(glm::qualifier)0> *)&local_1f4,0.0,0.551,0.8);
    v.field_0.field_0.z = (float)local_1ec;
    v.field_0._0_8_ = local_1f4;
    qe::Program::setUniform<5u>(pPVar1,v);
  }
  pMVar4 = std::unique_ptr<qe::Mesh<7U>,_std::default_delete<qe::Mesh<7U>_>_>::operator->
                     (&this->_ground);
  pvVar5 = std::array<qe::subobj_t,_16UL>::operator[](&this->_ground_indices,3);
  qe::Mesh<7U>::render_sub(pMVar4,pvVar5);
  pMVar4 = std::unique_ptr<qe::Mesh<7U>,_std::default_delete<qe::Mesh<7U>_>_>::operator->
                     (&this->_ground);
  pvVar5 = std::array<qe::subobj_t,_16UL>::operator[](&this->_ground_indices,4);
  qe::Mesh<7U>::render_sub(pMVar4,pvVar5);
  return;
}

Assistant:

void GameScreenImpl::renderTerrain() {
    glm::mat4 m = glm::translate(glm::vec3(18.099, 0, 10.963) + glm::vec3(-2 * 0.866, 0, -1.0));
    glm::mat4 mvp = _cam.camera->matrices().pv * m;
    qe::Program *ts = _terrain_render_geometry_pass ? _terrain_tileno_shader.get() : _terrain_shader.get();
    ts->use();
    ts->setUniform<qe::UNIMVP>(mvp);
    ts->setUniform<qe::UNIM>(m);
    ts->setUniform<qe::UNIV>(_cam.camera->matrices().v);
    if(_terrain_render_geometry_pass == false) {
        if(_cam.controlling) {
            ts->setUniform<qe::UNISEL>(glm::uvec2(9999, 9999));
        } else {
            ts->setUniform<qe::UNISEL>(to_uvec2(_selection.lastLookedAtTile));
        }
        ts->setUniform<qe::UNICOLOR>(glm::vec3(0.8, 0.8, 0.8));
    }
    // render grey areas
    _ground->render_sub(_ground_indices[DamMain_CUBezierCurve]);
    _ground->render_sub(_ground_indices[DamBaseBottom_Cube_001]);
    _ground->render_sub(_ground_indices[DamBaseBottom_001_Cube_002]);
    _ground->render_sub(_ground_indices[DamBaseBottom_002_Cube_003]);
    _ground->render_sub(_ground_indices[Cylinder_Cylinder_003]);
    _ground->render_sub(_ground_indices[Cylinder_001_Cylinder_006]);
    _ground->render_sub(_ground_indices[Cylinder_002_Cylinder_007]);
    // TODO render faction colors
    _ground->render_sub(_ground_indices[DamBaseMiddle_001_Cylinder_001]);
    _ground->render_sub(_ground_indices[DamBaseTop_001_Cone_001]);
    // render ground areas
    if(_terrain_render_geometry_pass == false) ts->setUniform<qe::UNICOLOR>(glm::vec3(0.8, 0.567, 0.305));
    _ground->render_sub(_ground_indices[Ground_Plane_002]);
    // render water
    if(_terrain_render_geometry_pass == false) ts->setUniform<qe::UNICOLOR>(glm::vec3(0.0, 0.551, 0.8));
    _ground->render_sub(_ground_indices[WaterPlane_Plane_003]);
    _ground->render_sub(_ground_indices[WaterBlock_Cube_004]);
}